

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

int cmpfortree(void *av,void *bv)

{
  if (*(int *)((long)bv + 8) <= *(int *)((long)av + 8)) {
    if (*(int *)((long)bv + 8) < *(int *)((long)av + 8)) {
      return 1;
    }
    if (bv <= av) {
      return (int)(bv < av);
    }
  }
  return -1;
}

Assistant:

static int cmpfortree(void *av, void *bv)
{
    NetSocket *a = (NetSocket *) av, *b = (NetSocket *) bv;
    int as = a->s, bs = b->s;
    if (as < bs)
        return -1;
    if (as > bs)
        return +1;
    if (a < b)
       return -1;
    if (a > b)
       return +1;
    return 0;
}